

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buckets.hpp
# Opt level: O2

iterator __thiscall
boost::unordered::detail::
table_impl<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::add_node(table_impl<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
           *this,node_constructor *a,size_t key_hash)

{
  ulong uVar1;
  size_t *psVar2;
  bucket_pointer ppVar3;
  node_pointer ppVar4;
  size_t sVar5;
  bucket_pointer ppVar6;
  ulong uVar7;
  
  ppVar4 = a->node_;
  a->node_ = (node_pointer)0x0;
  ppVar4->hash_ = key_hash;
  sVar5 = (this->
          super_table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
          ).bucket_count_;
  ppVar6 = (this->
           super_table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
           ).buckets_;
  uVar1 = sVar5 - 1;
  uVar7 = key_hash & uVar1;
  if (ppVar6[uVar7].next_ == (link_pointer)0x0) {
    ppVar3 = ppVar6 + sVar5;
    if (ppVar3->next_ != (link_pointer)0x0) {
      ppVar6[uVar1 & (ulong)ppVar3->next_[1].next_].next_ = &ppVar4->super_ptr_bucket;
    }
    ppVar6[uVar7].next_ = ppVar3;
    (ppVar4->super_ptr_bucket).next_ = ppVar3->next_;
    ppVar3->next_ = &ppVar4->super_ptr_bucket;
  }
  else {
    (ppVar4->super_ptr_bucket).next_ = (ppVar6[uVar7].next_)->next_;
    (ppVar6[uVar7].next_)->next_ = &ppVar4->super_ptr_bucket;
  }
  psVar2 = &(this->
            super_table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
            ).size_;
  *psVar2 = *psVar2 + 1;
  return (iterator)ppVar4;
}

Assistant:

node_pointer release()
        {
            BOOST_ASSERT(node_ && node_constructed_);
            node_pointer p = node_;
            node_ = node_pointer();
            return p;
        }